

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateFactorDiscrete.cpp
# Opt level: O0

string * __thiscall StateFactorDiscrete::SoftPrint_abi_cxx11_(StateFactorDiscrete *this)

{
  bool bVar1;
  ostream *poVar2;
  ostream *__lhs;
  reference pbVar3;
  string *in_RDI;
  const_iterator last;
  const_iterator it;
  stringstream ss;
  NamedDescribedEntity *in_stack_fffffffffffffdb8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  NamedDescribedEntity local_188 [5];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_188,"SF \'");
  NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffffdb8);
  poVar2 = std::operator<<(poVar2,local_1c8);
  poVar2 = std::operator<<(poVar2,"\' (");
  NamedDescribedEntity::GetDescription_abi_cxx11_(in_stack_fffffffffffffdb8);
  __lhs = std::operator<<(poVar2,local_1e8);
  std::operator<<(__lhs,"), values: {");
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c8);
  local_1f0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffdb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffdb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)__lhs,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)in_stack_fffffffffffffdb8), bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffdb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)__lhs,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffdb8);
    if (bVar1) {
      std::operator<<((ostream *)local_188,", ");
    }
    in_stack_fffffffffffffdb8 = local_188;
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_1f0);
    std::operator<<((ostream *)in_stack_fffffffffffffdb8,(string *)pbVar3);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)poVar2,(int)((ulong)__lhs >> 0x20));
  }
  std::operator<<((ostream *)local_188,"}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string StateFactorDiscrete::SoftPrint() const
{
    stringstream ss;

    ss << "SF '"<< GetName() << "' ("<<GetDescription()<<"), values: {";
    vector<string>::const_iterator it = _m_domainValues.begin();
    vector<string>::const_iterator last = _m_domainValues.end();
    while(it != last)
    {
        if(it != _m_domainValues.begin() )
            ss << ", ";
        ss << *it;
        it++;
    }
    ss << "}";
    return(ss.str() );
}